

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O3

int __thiscall libchess::Position::see_to(Position *this,Square square,array<int,_6UL> piece_values)

{
  PieceType piece_type;
  _Optional_payload<libchess::Square,_true,_true,_true> _Var1;
  ulong uVar2;
  ulong uVar3;
  pointer pcVar4;
  array<int,_6UL> piece_values_00;
  uint uVar5;
  int iVar6;
  Bitboard BVar7;
  undefined8 uVar8;
  ulong uVar9;
  array<int,_6UL> *paVar10;
  int iVar11;
  Move move;
  long lVar12;
  Position *pPVar13;
  value_type *pvVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  Position pos;
  undefined1 local_b8 [104];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  bVar18 = 0;
  iVar15 = (this->side_to_move_).super_MetaValueType<int>.value_;
  uVar9 = this->color_bb_[iVar15].value_ &
          (&lookups::PAWN_ATTACKS)
          [(ulong)((long)iVar15 == 0) * 0x40 + (long)(int)square.super_MetaValueType<int>.value_] &
          this->piece_type_bb_[0].value_;
  if (uVar9 == 0) {
    lVar12 = 4;
LAB_001148cd:
    piece_type.super_MetaValueType<int>.value_ =
         (MetaValueType<int>)
         ((MetaValueType<int> *)((long)&constants::PIECE_TYPES + lVar12))->value_;
    BVar7 = lookups::non_pawn_piece_type_attacks
                      (piece_type,square,this->color_bb_[1].value_ | this->color_bb_[0].value_);
    uVar9 = BVar7.value_ &
            this->color_bb_[(this->side_to_move_).super_MetaValueType<int>.value_].value_ &
            this->piece_type_bb_[(int)piece_type.super_MetaValueType<int>.value_].value_;
    if (uVar9 == 0) goto code_r0x001148f3;
    lVar12 = 0;
    if (uVar9 != 0) {
      for (; (uVar9 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
      }
    }
    uVar5 = (int)square.super_MetaValueType<int>.value_ << 6 | (uint)lVar12;
    goto LAB_00114932;
  }
  lVar12 = 0;
  if (uVar9 != 0) {
    for (; (uVar9 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  _Var1.super__Optional_payload_base<libchess::Square> =
       (this->history_).
       super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>.
       _M_impl.super__Vector_impl_data._M_start[this->ply_].enpassant_square_.
       super__Optional_base<libchess::Square,_true,_true>._M_payload.
       super__Optional_payload_base<libchess::Square>;
  if (_Var1.super__Optional_payload_base<libchess::Square>._M_payload ==
      (_Storage<libchess::Square,_true>)square.super_MetaValueType<int>.value_ &&
      ((ulong)_Var1.super__Optional_payload_base<libchess::Square> & 0x100000000) != 0) {
    move.value_ = (int)square.super_MetaValueType<int>.value_ << 6 | (uint)lVar12 | 0x18000;
  }
  else {
    iVar11 = 7 - ((int)square.super_MetaValueType<int>.value_ >> 3);
    if (iVar15 == 0) {
      iVar11 = (int)square.super_MetaValueType<int>.value_ >> 3;
    }
    uVar5 = (int)square.super_MetaValueType<int>.value_ << 6 | (uint)lVar12;
    if (iVar11 == 7) {
      move.value_ = uVar5 | 0x3c000;
    }
    else {
LAB_00114932:
      move.value_ = uVar5 | 0x30000;
    }
  }
  uVar9 = 1L << ((byte)square.super_MetaValueType<int>.value_ & 0x3f);
  lVar12 = 0;
  do {
    uVar5 = *(uint *)((long)&constants::PIECE_TYPES + lVar12);
    uVar2 = this->piece_type_bb_[(int)uVar5].value_;
    if ((uVar2 & uVar9) != 0) goto LAB_00114974;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x18);
  uVar5 = 0;
LAB_00114974:
  lVar12 = 0;
  do {
    uVar3 = this->color_bb_[*(int *)((long)&constants::COLORS + lVar12)].value_;
    if ((uVar3 & uVar9) != 0) break;
    bVar16 = lVar12 != 4;
    lVar12 = lVar12 + 4;
  } while (bVar16);
  bVar16 = (uVar3 & uVar9) == 0;
  if (bVar16) {
    uVar5 = 0;
  }
  bVar17 = (uVar2 & uVar9) == 0;
  if (bVar17) {
    uVar5 = 0;
  }
  if (((move.value_ & 0x38000U) == 0x18000) || (!bVar17 && !bVar16)) {
    paVar10 = &piece_values;
    if ((move.value_ & 0x38000U) != 0x18000) {
      uVar9 = (ulong)(uVar5 & 7);
      if (5 < uVar9) goto LAB_00114ac8;
      paVar10 = (array<int,_6UL> *)((long)piece_values._M_elems + uVar9 * 4);
    }
    iVar15 = paVar10->_M_elems[0];
    uVar5 = (uint)move.value_ >> 0xc & 7;
    if ((uVar5 != 0) && (uVar5 != 5)) {
      uVar9 = (ulong)uVar5;
      if (5 < uVar5) {
LAB_00114ac8:
        uVar8 = std::__throw_out_of_range_fmt
                          ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar9,6);
        ~Position((Position *)local_b8);
        _Unwind_Resume(uVar8);
      }
      iVar15 = (iVar15 + *(int *)((long)piece_values._M_elems + uVar9 * 4)) -
               piece_values._M_elems[0];
    }
    pPVar13 = this;
    pvVar14 = (value_type *)local_b8;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      *pvVar14 = pPVar13->piece_type_bb_[0].value_;
      pPVar13 = (Position *)((long)pPVar13 + (ulong)bVar18 * -0x10 + 8);
      pvVar14 = pvVar14 + (ulong)bVar18 * -2 + 1;
    }
    local_b8._72_4_ = this->ply_;
    std::vector<libchess::Position::State,_std::allocator<libchess::Position::State>_>::vector
              ((vector<libchess::Position::State,_std::allocator<libchess::Position::State>_> *)
               (local_b8 + 0x50),&this->history_);
    pcVar4 = (this->start_fen_)._M_dataplus._M_p;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,pcVar4 + (this->start_fen_)._M_string_length);
    make_move((Position *)local_b8,move);
    piece_values_00._M_elems[1] = piece_values._M_elems[1];
    piece_values_00._M_elems[0] = piece_values._M_elems[0];
    piece_values_00._M_elems[2] = piece_values._M_elems[2];
    piece_values_00._M_elems[3] = piece_values._M_elems[3];
    piece_values_00._M_elems[4] = piece_values._M_elems[4];
    piece_values_00._M_elems[5] = piece_values._M_elems[5];
    iVar6 = see_to((Position *)local_b8,square,piece_values_00);
    iVar11 = 0;
    if (0 < iVar15 - iVar6) {
      iVar11 = iVar15 - iVar6;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((pointer)local_b8._80_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._80_8_,local_b8._96_8_ - local_b8._80_8_);
    }
  }
  else {
LAB_001149b9:
    iVar11 = 0;
  }
  return iVar11;
code_r0x001148f3:
  lVar12 = lVar12 + 4;
  if (lVar12 == 0x18) goto LAB_001149b9;
  goto LAB_001148cd;
}

Assistant:

inline int Position::see_to(Square square, std::array<int, 6> piece_values) {
    auto smallest_capture_move = smallest_capture_move_to(square);
    if (!smallest_capture_move) {
        return 0;
    }
    bool is_enpassant = smallest_capture_move->type() == Move::Type::ENPASSANT;

    auto square_pt = piece_on(square);
    if (!square_pt && !is_enpassant) {
        return 0;
    }

    int piece_val = is_enpassant ? piece_values.at(0) : piece_values.at(square_pt->type().value());
    auto smallest_capture_move_prom_piece_type = smallest_capture_move->promotion_piece_type();
    if (smallest_capture_move_prom_piece_type) {
        piece_val +=
            piece_values.at(smallest_capture_move_prom_piece_type->value()) - piece_values.at(0);
    }
    Position pos = *this;
    pos.make_move(*smallest_capture_move);
    return std::max(0, piece_val - pos.see_to(square, piece_values));
}